

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

MeshPointOrigin * iDynTree::optimalcontrol::MeshPointOrigin::LastPoint(void)

{
  MeshPointOrigin *in_RDI;
  string *in_stack_ffffffffffffff98;
  string local_60 [4];
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  MeshPointOrigin *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  MeshPointOrigin(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                  in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return in_RDI;
}

Assistant:

static MeshPointOrigin LastPoint() {return MeshPointOrigin("LastPoint", 8, "The last point");}